

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::GenObjectBuilder
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *builder_name,string *code)

{
  byte bVar1;
  FieldDef *pFVar2;
  Namespace *pNVar3;
  bool bVar4;
  size_type_conflict sVar5;
  pointer ppVar6;
  char *__lhs;
  Value *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_3c8;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_3c0;
  string local_3b8;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  FieldDef *local_318;
  FieldDef *field_2;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_308;
  const_iterator it_2;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  FieldDef *local_218;
  FieldDef *field_1;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_208;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  FieldDef *local_d8;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_c8;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code_local;
  string *builder_name_local;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  local_30 = code;
  code_local = builder_name;
  builder_name_local = (string *)non_deprecated_fields;
  non_deprecated_fields_local =
       (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        *)struct_def;
  struct_def_local = (StructDef *)this;
  std::operator+(&local_b0,"class ",builder_name);
  std::operator+(&local_90,&local_b0," extends ");
  std::operator+(&local_70,&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_50,&local_70,".ObjectBuilder {\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  local_c8._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)builder_name_local);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                   *)builder_name_local);
    bVar4 = __gnu_cxx::operator!=
                      (&local_c8,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar4) break;
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_c8);
    pFVar2 = ppVar6->second;
    pNVar3 = (Namespace *)
             non_deprecated_fields_local[7].
             super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = *(byte *)&non_deprecated_fields_local[0xb].
                      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    local_d8 = pFVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"ObjectBuilder",&local_199);
    GenDartTypeName(&local_178,this,&(pFVar2->value).type,pNVar3,pFVar2,(bool)((bVar1 ^ 1) & 1),
                    &local_198);
    std::operator+(&local_158,"  final ",&local_178);
    std::operator+(&local_138,&local_158," _");
    IdlNamer::Variable_abi_cxx11_(&local_1c0,&this->namer_,local_d8);
    std::operator+(&local_118,&local_138,&local_1c0);
    std::operator+(&local_f8,&local_118,";\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_c8);
  }
  std::__cxx11::string::operator+=((string *)local_30,"\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,"  ",
                 code_local);
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,"(");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&it_1);
  sVar5 = std::
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          ::size((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)builder_name_local);
  if (sVar5 == 0) {
    std::__cxx11::string::operator+=((string *)local_30,");\n\n");
  }
  else {
    std::__cxx11::string::operator+=((string *)local_30,"{\n");
    local_208._M_current =
         (pair<int,_flatbuffers::FieldDef_*> *)
         std::
         vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
         ::begin((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)builder_name_local);
    while( true ) {
      field_1 = (FieldDef *)
                std::
                vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                ::end((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       *)builder_name_local);
      bVar4 = __gnu_cxx::operator!=
                        (&local_208,
                         (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                          *)&field_1);
      if (!bVar4) break;
      ppVar6 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
               ::operator->(&local_208);
      local_218 = ppVar6->second;
      std::__cxx11::string::operator+=((string *)local_30,"    ");
      pFVar2 = local_218;
      bVar1 = *(byte *)&non_deprecated_fields_local[0xb].
                        super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      __lhs = "";
      if ((bVar1 & 1) != 0) {
        __lhs = "required ";
      }
      type = &local_218->value;
      pNVar3 = (Namespace *)
               non_deprecated_fields_local[7].
               super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"ObjectBuilder",&local_2d9);
      GenDartTypeName(&local_2b8,this,&type->type,pNVar3,pFVar2,(bool)((bVar1 ^ 1) & 1),&local_2d8);
      std::operator+(&local_298,__lhs,&local_2b8);
      std::operator+(&local_278,&local_298," ");
      IdlNamer::Variable_abi_cxx11_((string *)&it_2,&this->namer_,local_218);
      std::operator+(&local_258,&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2);
      std::operator+(&local_238,&local_258,",\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&it_2);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
      ::operator++(&local_208);
    }
    std::__cxx11::string::operator+=((string *)local_30,"  })\n");
    std::__cxx11::string::operator+=((string *)local_30,"      : ");
    local_308._M_current =
         (pair<int,_flatbuffers::FieldDef_*> *)
         std::
         vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
         ::begin((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)builder_name_local);
    while( true ) {
      field_2 = (FieldDef *)
                std::
                vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                ::end((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       *)builder_name_local);
      bVar4 = __gnu_cxx::operator!=
                        (&local_308,
                         (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                          *)&field_2);
      if (!bVar4) break;
      ppVar6 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
               ::operator->(&local_308);
      local_318 = ppVar6->second;
      IdlNamer::Variable_abi_cxx11_(&local_398,&this->namer_,local_318);
      std::operator+(&local_378,"_",&local_398);
      std::operator+(&local_358,&local_378," = ");
      IdlNamer::Variable_abi_cxx11_(&local_3b8,&this->namer_,local_318);
      std::operator+(&local_338,&local_358,&local_3b8);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      local_3c8._M_current =
           (pair<int,_flatbuffers::FieldDef_*> *)
           std::
           vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           ::end((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)builder_name_local);
      local_3c0 = __gnu_cxx::
                  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                  ::operator-(&local_3c8,1);
      bVar4 = __gnu_cxx::operator==(&local_308,&local_3c0);
      if (bVar4) {
        std::__cxx11::string::operator+=((string *)local_30,";\n\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_30,",\n        ");
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
      ::operator++(&local_308);
    }
  }
  std::__cxx11::string::operator+=
            ((string *)local_30,"  /// Finish building, and store into the [fbBuilder].\n");
  std::__cxx11::string::operator+=((string *)local_30,"  @override\n");
  std::operator+(&local_408,"  int finish(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_3e8,&local_408,".Builder fbBuilder) {\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  GenObjectBuilderImplementation_abi_cxx11_
            (&local_428,this,(StructDef *)non_deprecated_fields_local,
             (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
              *)builder_name_local,true,false);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::operator+=((string *)local_30,"  }\n\n");
  std::__cxx11::string::operator+=
            ((string *)local_30,"  /// Convenience method to serialize to byte list.\n");
  std::__cxx11::string::operator+=((string *)local_30,"  @override\n");
  std::__cxx11::string::operator+=
            ((string *)local_30,"  Uint8List toBytes([String? fileIdentifier]) {\n");
  std::operator+(&local_468,"    final fbBuilder = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_448,&local_468,".Builder(deduplicateTables: false);\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::operator+=
            ((string *)local_30,"    fbBuilder.finish(finish(fbBuilder), fileIdentifier);\n");
  std::__cxx11::string::operator+=((string *)local_30,"    return fbBuilder.buffer;\n");
  std::__cxx11::string::operator+=((string *)local_30,"  }\n");
  std::__cxx11::string::operator+=((string *)local_30,"}\n");
  return;
}

Assistant:

void GenObjectBuilder(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      const std::string &builder_name, std::string &code) {
    code += "class " + builder_name + " extends " + _kFb + ".ObjectBuilder {\n";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      code += "  final " +
              GenDartTypeName(field.value.type, struct_def.defined_namespace,
                              field, !struct_def.fixed, "ObjectBuilder") +
              " _" + namer_.Variable(field) + ";\n";
    }
    code += "\n";
    code += "  " + builder_name + "(";

    if (non_deprecated_fields.size() != 0) {
      code += "{\n";
      for (auto it = non_deprecated_fields.begin();
           it != non_deprecated_fields.end(); ++it) {
        const FieldDef &field = *it->second;

        code += "    ";
        code += (struct_def.fixed ? "required " : "") +
                GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field, !struct_def.fixed, "ObjectBuilder") +
                " " + namer_.Variable(field) + ",\n";
      }
      code += "  })\n";
      code += "      : ";
      for (auto it = non_deprecated_fields.begin();
           it != non_deprecated_fields.end(); ++it) {
        const FieldDef &field = *it->second;

        code += "_" + namer_.Variable(field) + " = " + namer_.Variable(field);
        if (it == non_deprecated_fields.end() - 1) {
          code += ";\n\n";
        } else {
          code += ",\n        ";
        }
      }
    } else {
      code += ");\n\n";
    }

    code += "  /// Finish building, and store into the [fbBuilder].\n";
    code += "  @override\n";
    code += "  int finish(" + _kFb + ".Builder fbBuilder) {\n";
    code += GenObjectBuilderImplementation(struct_def, non_deprecated_fields);
    code += "  }\n\n";

    code += "  /// Convenience method to serialize to byte list.\n";
    code += "  @override\n";
    code += "  Uint8List toBytes([String? fileIdentifier]) {\n";
    code += "    final fbBuilder = " + _kFb +
            ".Builder(deduplicateTables: false);\n";
    code += "    fbBuilder.finish(finish(fbBuilder), fileIdentifier);\n";
    code += "    return fbBuilder.buffer;\n";
    code += "  }\n";
    code += "}\n";
  }